

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O3

double smf_get_length_seconds(smf_t *smf)

{
  double dVar1;
  smf_track_t *track;
  smf_event_t *psVar2;
  int track_number;
  double local_18;
  
  if (smf->number_of_tracks < 1) {
    local_18 = 0.0;
  }
  else {
    local_18 = 0.0;
    track_number = 0;
    do {
      track_number = track_number + 1;
      track = smf_get_track_by_number(smf,track_number);
      if (track == (smf_track_t *)0x0) {
        __assert_fail("track",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                      ,0x434,"double smf_get_length_seconds(const smf_t *)");
      }
      dVar1 = local_18;
      if (((track->number_of_events != 0) &&
          (psVar2 = smf_track_get_event_by_number(track,track->number_of_events),
          psVar2 != (smf_event_t *)0x0)) &&
         (dVar1 = psVar2->time_seconds, psVar2->time_seconds <= local_18)) {
        dVar1 = local_18;
      }
      local_18 = dVar1;
    } while (track_number < smf->number_of_tracks);
  }
  return local_18;
}

Assistant:

double
smf_get_length_seconds(const smf_t *smf)
{
	int i;
	double seconds = 0.0;

	for (i = 1; i <= smf->number_of_tracks; i++) {
		smf_track_t *track;
		smf_event_t *event;

	       	track = smf_get_track_by_number(smf, i);
		assert(track);

		event = smf_track_get_last_event(track);
		/* Empty track? */
		if (event == NULL)
			continue;

		if (event->time_seconds > seconds)
			seconds = event->time_seconds;
	}

	return (seconds);
}